

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

bool __thiscall CInput::KeyState(CInput *this,int Key)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  int local_24;
  byte local_d;
  
  local_d = 0;
  if ((-1 < in_ESI) && (local_d = 0, in_ESI < 0x1da)) {
    local_24 = in_ESI;
    if (in_ESI < 0x19b) {
      iVar1 = KeyToKeycode(in_ESI);
      local_24 = SDL_GetScancodeFromKey(iVar1);
    }
    local_d = *(byte *)(in_RDI + 0x1aa0 + (long)local_24);
  }
  return (bool)(local_d & 1);
}

Assistant:

bool CInput::KeyState(int Key) const
{
	return Key >= KEY_FIRST
		&& Key < KEY_LAST
		&& m_aInputState[Key>=KEY_MOUSE_1 ? Key : SDL_GetScancodeFromKey(KeyToKeycode(Key))];
}